

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

bitset_t * bitset_create(void)

{
  bitset_t *pbVar1;
  
  pbVar1 = (bitset_t *)roaring_malloc(0x18);
  if (pbVar1 != (bitset_t *)0x0) {
    pbVar1->array = (uint64_t *)0x0;
    pbVar1->arraysize = 0;
    pbVar1->capacity = 0;
    return pbVar1;
  }
  return (bitset_t *)0x0;
}

Assistant:

bitset_t *bitset_create(void) {
    bitset_t *bitset = NULL;
    /* Allocate the bitset itself. */
    if ((bitset = (bitset_t *)roaring_malloc(sizeof(bitset_t))) == NULL) {
        return NULL;
    }
    bitset->array = NULL;
    bitset->arraysize = 0;
    bitset->capacity = 0;
    return bitset;
}